

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# csp_rdp_queue.c
# Opt level: O0

csp_packet_t * csp_rdp_queue_get(csp_queue_handle_t queue,csp_conn_t *conn)

{
  int iVar1;
  int iVar2;
  csp_conn_s *in_RSI;
  int size;
  csp_packet_t *packet;
  undefined4 in_stack_ffffffffffffffd8;
  csp_packet_t *in_stack_ffffffffffffffe0;
  
  iVar1 = csp_queue_size((csp_queue_handle_t)0x10ed88);
  while( true ) {
    iVar2 = iVar1 + -1;
    if (iVar1 == 0) {
      return (csp_packet_t *)0x0;
    }
    iVar1 = csp_queue_dequeue((csp_queue_handle_t)in_stack_ffffffffffffffe0,
                              (void *)CONCAT44(iVar2,in_stack_ffffffffffffffd8),0);
    if (iVar1 != 0) break;
    if ((in_stack_ffffffffffffffe0->field_0).field_0.conn == in_RSI) {
      return in_stack_ffffffffffffffe0;
    }
    csp_rdp_queue_add((csp_queue_handle_t)in_stack_ffffffffffffffe0,
                      (csp_conn_t *)CONCAT44(iVar2,in_stack_ffffffffffffffd8),
                      (csp_packet_t *)0x10edef);
    iVar1 = iVar2;
  }
  return (csp_packet_t *)0x0;
}

Assistant:

static csp_packet_t * csp_rdp_queue_get(csp_queue_handle_t queue, csp_conn_t * conn) {
    csp_packet_t * packet;
    int size = csp_queue_size(queue);

    while(size--) {
        if (csp_queue_dequeue(queue, &packet, 0) != CSP_QUEUE_OK) {
            /* Error */
            return NULL;
        }

        if (packet->conn == conn) {
            /* Found it */
            return packet;
        }

        /* Put it back and check next */
        csp_rdp_queue_add(queue, conn, packet);
    }

    return NULL;
}